

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageAndMetadata * pbrt::ReadPFM(string *filename,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this;
  size_t sVar4;
  reference pvVar5;
  string *in_RSI;
  ImageAndMetadata *in_RDI;
  string *this_00;
  float fVar6;
  uint i_1;
  uint i;
  uint8_t bytes [4];
  int y;
  FILE *fp;
  ImageMetadata metadata;
  bool fileLittleEndian;
  float scale;
  int height;
  int width;
  int nChannels;
  size_t nFloats;
  char buffer [80];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgb32;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffb18;
  ImageMetadata *in_stack_fffffffffffffb20;
  iterator in_stack_fffffffffffffb28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  ImageMetadata *in_stack_fffffffffffffb78;
  ImageMetadata *pIVar8;
  undefined4 in_stack_fffffffffffffb80;
  LogLevel in_stack_fffffffffffffb84;
  ImageMetadata *this_01;
  char *in_stack_fffffffffffffb88;
  int *in_stack_fffffffffffffb90;
  optional<float> *local_428;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffbf0;
  ImageAndMetadata *p32c;
  undefined4 in_stack_fffffffffffffbf8;
  float in_stack_fffffffffffffbfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  reference in_stack_fffffffffffffc08;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc10;
  allocator<char> local_38b;
  undefined1 local_38a [2];
  ImageMetadata *local_388;
  string local_380 [32];
  undefined1 local_360 [104];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_2f8;
  undefined4 local_2d8;
  undefined1 local_2d2 [10];
  optional<float> local_2c8 [4];
  optional<float> local_2a8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2a0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_280;
  uint local_260;
  uint local_25c;
  undefined4 local_258;
  int local_254;
  string local_210 [32];
  FILE *local_1f0;
  undefined1 local_b1;
  float local_b0;
  polymorphic_allocator<std::byte> local_ac;
  int local_a4;
  ulong local_a0;
  char local_98 [88];
  polymorphic_allocator<float> local_40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_38;
  string *local_18;
  
  local_18 = in_RSI;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(&local_38,&local_40);
  ImageMetadata::ImageMetadata(in_stack_fffffffffffffb20);
  std::__cxx11::string::string(local_210,local_18);
  pFVar3 = (FILE *)FOpenRead((string *)0x9c39a5);
  std::__cxx11::string::~string(local_210);
  local_1f0 = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  }
  iVar2 = readWord((FILE *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                   (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  if (iVar2 != -1) {
    iVar2 = strcmp(local_98,"Pf");
    if (iVar2 == 0) {
      local_a4 = 1;
    }
    else {
      iVar2 = strcmp(local_98,"PF");
      if (iVar2 != 0) {
        ErrorExit<std::__cxx11::string_const&,char&,char&>
                  ((char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   (char *)in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      }
      local_a4 = 3;
    }
    iVar2 = readWord((FILE *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                     (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    if (iVar2 != -1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
      str._M_len._4_4_ = in_stack_fffffffffffffb84;
      str._M_len._0_4_ = in_stack_fffffffffffffb80;
      str._M_str = in_stack_fffffffffffffb88;
      bVar1 = Atoi(str,(int *)in_stack_fffffffffffffb78);
      if (!bVar1) {
        ErrorExit<std::__cxx11::string_const&,char(&)[80]>
                  ((char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   (char (*) [80])in_stack_fffffffffffffb50);
      }
      iVar2 = readWord((FILE *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                       (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
      if (iVar2 != -1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
        str_00._M_len._4_4_ = in_stack_fffffffffffffb84;
        str_00._M_len._0_4_ = in_stack_fffffffffffffb80;
        str_00._M_str = in_stack_fffffffffffffb88;
        bVar1 = Atoi(str_00,(int *)in_stack_fffffffffffffb78);
        if (!bVar1) {
          ErrorExit<std::__cxx11::string_const&,char(&)[80]>
                    ((char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     (char (*) [80])in_stack_fffffffffffffb50);
        }
        iVar2 = readWord((FILE *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                         (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
        if (iVar2 != -1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
          str_01._M_len._4_4_ = in_stack_fffffffffffffb84;
          str_01._M_len._0_4_ = in_stack_fffffffffffffb80;
          str_01._M_str = in_stack_fffffffffffffb88;
          bVar1 = Atof(str_01,(float *)in_stack_fffffffffffffb78);
          if (!bVar1) {
            ErrorExit<std::__cxx11::string_const&,char(&)[80]>
                      ((char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                       (char (*) [80])in_stack_fffffffffffffb50);
          }
          local_a0 = (long)local_a4 * (long)local_ac.memoryResource._4_4_ *
                     (long)(int)local_ac.memoryResource;
          this = &local_38;
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                    (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
          do {
            local_254 = (int)local_ac.memoryResource + -1;
            if (local_254 < 0) {
              local_b1 = local_b0 < 0.0;
              if (!(bool)local_b1) {
                for (local_25c = 0; local_25c < local_a0; local_25c = local_25c + 1) {
                  in_stack_fffffffffffffc10 = (Tuple2<pbrt::Point2,_int>)&local_258;
                  pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                                     (&local_38,(ulong)local_25c);
                  *(value_type_conflict1 *)in_stack_fffffffffffffc10 = *pvVar5;
                  pstd::swap<unsigned_char>((uchar *)&local_258,(uchar *)((long)&local_258 + 3));
                  pstd::swap<unsigned_char>
                            ((uchar *)((long)&local_258 + 1),(uchar *)((long)&local_258 + 2));
                  this = &local_38;
                  in_stack_fffffffffffffc08 =
                       pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                                 (this,(ulong)local_25c);
                  *in_stack_fffffffffffffc08 = local_258;
                }
              }
              fVar6 = local_b0;
              std::abs((int)this);
              iVar2 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20);
              if ((fVar6 != 1.0) || (NAN(fVar6))) {
                for (local_260 = 0; iVar2 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                    local_260 < local_a0; local_260 = local_260 + 1) {
                  in_stack_fffffffffffffbfc = local_b0;
                  std::abs((int)this);
                  this = &local_38;
                  in_stack_fffffffffffffc00 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                                 (this,(ulong)local_260);
                  *(float *)in_stack_fffffffffffffc00 =
                       in_stack_fffffffffffffbfc * *(float *)in_stack_fffffffffffffc00;
                }
              }
              fclose(local_1f0);
              if (logging::logLevel < 1) {
                in_stack_fffffffffffffb18 = &local_ac;
                Log<std::__cxx11::string_const&,int&,int&>
                          (in_stack_fffffffffffffb84,(char *)in_stack_fffffffffffffb78,iVar2,
                           in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                           (int *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb90);
              }
              pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                        ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffffb20,
                         (RGBColorSpace **)in_stack_fffffffffffffb18);
              if (local_a4 == 1) {
                p32c = in_RDI;
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                          (&local_280,&local_38);
                Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb20,
                                    (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                                    (int)in_stack_fffffffffffffb18);
                local_2d2[0] = '\x01';
                local_2d2._2_8_ = local_2c8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                           (allocator<char> *)in_stack_fffffffffffffb50);
                local_2d2[0] = '\0';
                local_2a8 = (optional<float>)local_2c8;
                local_2a0 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                             )0x1;
                v._M_len = (size_type)in_stack_fffffffffffffb30;
                v._M_array = in_stack_fffffffffffffb28;
                pstd::
                span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb20,v);
                channels.n = (size_t)in_stack_fffffffffffffc08;
                channels.ptr = in_stack_fffffffffffffc00;
                Image::Image((Image *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)p32c,
                             (Point2i)in_stack_fffffffffffffc10,channels);
                ImageMetadata::ImageMetadata
                          ((ImageMetadata *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           in_stack_fffffffffffffb78);
                local_428 = &local_2a8;
                do {
                  local_428 = local_428 + -4;
                  std::__cxx11::string::~string((string *)local_428);
                } while (local_428 != local_2c8);
                std::allocator<char>::~allocator((allocator<char> *)(local_2d2 + 1));
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                          ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                           in_stack_fffffffffffffb20);
              }
              else {
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                          (&local_2f8,&local_38);
                Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb20,
                                    (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                                    (int)in_stack_fffffffffffffb18);
                local_388 = (ImageMetadata *)local_380;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                           (allocator<char> *)in_stack_fffffffffffffb50);
                pIVar8 = (ImageMetadata *)local_360;
                this_01 = (ImageMetadata *)local_38a;
                local_388 = pIVar8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                           (allocator<char> *)in_stack_fffffffffffffb50);
                local_388 = (ImageMetadata *)(local_360 + 0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                           (allocator<char> *)in_stack_fffffffffffffb50);
                local_360._64_8_ = local_380;
                local_360._72_8_ = 3;
                v_00._M_len = (size_type)in_stack_fffffffffffffb30;
                v_00._M_array = in_stack_fffffffffffffb28;
                pstd::
                span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb20,v_00);
                channels_00.n = (size_t)in_stack_fffffffffffffc08;
                channels_00.ptr = in_stack_fffffffffffffc00;
                Image::Image((Image *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                             in_stack_fffffffffffffbf0,(Point2i)in_stack_fffffffffffffc10,
                             channels_00);
                ImageMetadata::ImageMetadata(this_01,pIVar8);
                psVar7 = local_380;
                this_00 = (string *)(local_360 + 0x40);
                do {
                  this_00 = this_00 + -0x20;
                  std::__cxx11::string::~string(this_00);
                } while (this_00 != psVar7);
                std::allocator<char>::~allocator(&local_38b);
                std::allocator<char>::~allocator((allocator<char> *)local_38a);
                std::allocator<char>::~allocator((allocator<char> *)(local_38a + 1));
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                          ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                           in_stack_fffffffffffffb20);
              }
              local_2d8 = 1;
              ImageMetadata::~ImageMetadata(in_stack_fffffffffffffb20);
              pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                         in_stack_fffffffffffffb20);
              return in_RDI;
            }
            this = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (&local_38,(long)(local_a4 * local_254 * local_ac.memoryResource._4_4_)
                             );
            sVar4 = fread(this,4,(long)(local_a4 * local_ac.memoryResource._4_4_),local_1f0);
            local_ac.memoryResource._0_4_ = local_254;
          } while (sVar4 == (long)(local_a4 * local_ac.memoryResource._4_4_));
        }
      }
    }
    if (local_1f0 != (FILE *)0x0) {
      fclose(local_1f0);
    }
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  }
  ErrorExit<std::__cxx11::string_const&>
            ((char *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
}

Assistant:

static ImageAndMetadata ReadPFM(const std::string &filename, Allocator alloc) {
    pstd::vector<float> rgb32(alloc);
    char buffer[BUFFER_SIZE];
    size_t nFloats;
    int nChannels, width, height;
    float scale;
    bool fileLittleEndian;
    ImageMetadata metadata;

    FILE *fp = FOpenRead(filename);
    if (!fp)
        ErrorExit("%s: unable to open PFM file", filename);

    // read either "Pf" or "PF"
    if (readWord(fp, buffer, BUFFER_SIZE) == -1)
        ErrorExit("%s: unable to read PFM file", filename);

    if (strcmp(buffer, "Pf") == 0)
        nChannels = 1;
    else if (strcmp(buffer, "PF") == 0)
        nChannels = 3;
    else
        ErrorExit("%s: unable to decode PFM file type \"%c%c\"", filename, buffer[0],
                  buffer[1]);

    // read the rest of the header
    // read width
    if (readWord(fp, buffer, BUFFER_SIZE) == -1)
        goto fail;
    if (!Atoi(buffer, &width))
        ErrorExit("%s: unable to decode width \"%s\"", filename, buffer);

    // read height
    if (readWord(fp, buffer, BUFFER_SIZE) == -1)
        goto fail;
    if (!Atoi(buffer, &height))
        ErrorExit("%s: unable to decode height \"%s\"", filename, buffer);

    // read scale
    if (readWord(fp, buffer, BUFFER_SIZE) == -1)
        goto fail;
    if (!Atof(buffer, &scale))
        ErrorExit("%s: unable to decode scale \"%s\"", filename, buffer);

    // read the data
    nFloats = nChannels * size_t(width) * size_t(height);
    rgb32.resize(nFloats);
    for (int y = height - 1; y >= 0; --y)
        if (fread(&rgb32[nChannels * y * width], sizeof(float), nChannels * width, fp) !=
            nChannels * width)
            goto fail;

    // apply endian conversian and scale if appropriate
    fileLittleEndian = (scale < 0.f);
    if (hostLittleEndian ^ fileLittleEndian) {
        uint8_t bytes[4];
        for (unsigned int i = 0; i < nFloats; ++i) {
            memcpy(bytes, &rgb32[i], 4);
            pstd::swap(bytes[0], bytes[3]);
            pstd::swap(bytes[1], bytes[2]);
            memcpy(&rgb32[i], bytes, 4);
        }
    }
    if (std::abs(scale) != 1.f)
        for (unsigned int i = 0; i < nFloats; ++i)
            rgb32[i] *= std::abs(scale);

    fclose(fp);
    LOG_VERBOSE("Read PFM image %s (%d x %d)", filename, width, height);
    metadata.colorSpace = RGBColorSpace::sRGB;
    if (nChannels == 1)
        return ImageAndMetadata{Image(std::move(rgb32), {width, height}, {"Y"}),
                                metadata};
    else
        return ImageAndMetadata{Image(std::move(rgb32), {width, height}, {"R", "G", "B"}),
                                metadata};

fail:
    if (fp)
        fclose(fp);
    ErrorExit("%s: premature end of file in PFM file", filename);
}